

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test::
TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test
          (TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test4 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test3 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).output = (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1 = (MockTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).mockResult = (MockTestResult *)0x0;
  TEST_GROUP_CppUTestGroupTestRegistry::TEST_GROUP_CppUTestGroupTestRegistry
            (&this->super_TEST_GROUP_CppUTestGroupTestRegistry);
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00379de0;
  return;
}

Assistant:

TEST(TestRegistry, runTwoTestsCheckResultFunctionsCalled)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    myRegistry->runAllTests(*result);
    LONGS_EQUAL(1, mockResult->countTestsStarted);
    LONGS_EQUAL(1, mockResult->countTestsEnded);
    LONGS_EQUAL(1, mockResult->countCurrentGroupStarted);
    LONGS_EQUAL(1, mockResult->countCurrentGroupEnded);
    LONGS_EQUAL(2, mockResult->countCurrentTestStarted);
    LONGS_EQUAL(2, mockResult->countCurrentTestEnded);
}